

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDEdgeSharpness ON_SubDEdgeSharpness::FromInterval(double sharpness0,double sharpness1)

{
  double dVar1;
  double sharpness1_local;
  double sharpness0_local;
  ON_SubDEdgeSharpness s;
  
  if ((((sharpness0 < 0.0) || (4.0 < sharpness0)) || (sharpness1 < 0.0)) || (4.0 < sharpness1)) {
    if (((sharpness0 != 5.0) || (NAN(sharpness0))) || ((sharpness1 != 5.0 || (NAN(sharpness1))))) {
      sharpness0_local = (double)Nan.m_edge_sharpness;
    }
    else {
      sharpness0_local = (double)Crease.m_edge_sharpness;
    }
  }
  else {
    ON_SubDEdgeSharpness((ON_SubDEdgeSharpness *)&sharpness0_local);
    dVar1 = Sanitize(sharpness0,0.0);
    sharpness0_local = (double)CONCAT44(sharpness0_local._4_4_,(float)dVar1);
    dVar1 = Sanitize(sharpness1,0.0);
    sharpness0_local = (double)CONCAT44((float)dVar1,sharpness0_local._0_4_);
  }
  return (ON_SubDEdgeSharpness)(float  [2])sharpness0_local;
}

Assistant:

const ON_SubDEdgeSharpness ON_SubDEdgeSharpness::FromInterval(
  double sharpness0,
  double sharpness1
)
{
  if (sharpness0 >= 0.0 && sharpness0 <= ON_SubDEdgeSharpness::MaximumValue 
    && sharpness1 >= 0.0 && sharpness1 <= ON_SubDEdgeSharpness::MaximumValue)
  {
    ON_SubDEdgeSharpness s;
    s.m_edge_sharpness[0] = (float)ON_SubDEdgeSharpness::Sanitize(sharpness0, 0.0);
    s.m_edge_sharpness[1] = (float)ON_SubDEdgeSharpness::Sanitize(sharpness1, 0.0);
    return s;
  }
  
  if (ON_SubDEdgeSharpness::CreaseValue == sharpness0 && ON_SubDEdgeSharpness::CreaseValue == sharpness1)
  {
    return ON_SubDEdgeSharpness::Crease;
  }

  return ON_SubDEdgeSharpness::Nan;
}